

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O2

int format_decimal(int64_t v,char *p,int s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (v < 0) {
    iVar1 = -1;
    for (; 0 < s; s = s + -1) {
      *p = '0';
      p = p + 1;
    }
  }
  else {
    pcVar3 = p + (uint)s;
    uVar4 = (long)(s + -1) + 1;
    do {
      uVar2 = v;
      pcVar3[-1] = (byte)(uVar2 % 10) | 0x30;
      pcVar3 = pcVar3 + -1;
      uVar5 = uVar4 - 1;
      if ((int)uVar4 < 2) break;
      v = uVar2 / 10;
      uVar4 = uVar5;
    } while (9 < uVar2);
    if (uVar2 < 10) {
      memmove(p,pcVar3,(long)s - uVar5);
      pcVar3 = p + (uint)s + -uVar5;
      for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
        *pcVar3 = ' ';
        pcVar3 = pcVar3 + 1;
      }
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
      for (; 0 < s; s = s + -1) {
        *pcVar3 = '9';
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
format_decimal(int64_t v, char *p, int s)
{
	int len;
	char *h;

	len = s;
	h = p;

	/* Negative values in ar header are meaningless, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;
	do {
		*--p = (char)('0' + (v % 10));
		v /= 10;
	} while (--s > 0 && v > 0);

	if (v == 0) {
		memmove(h, p, len - s);
		p = h + len - s;
		while (s-- > 0)
			*p++ = ' ';
		return (0);
	}
	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '9';

	return (-1);
}